

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int resolveCompoundOrderBy(Parse *pParse,Select *pSelect)

{
  byte *pbVar1;
  u8 uVar2;
  sqlite3 *psVar3;
  Expr **ppEVar4;
  Select *pSVar5;
  Select *pSVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  Expr *pEVar10;
  long lVar11;
  long lVar12;
  Expr *pE;
  ExprList_item *pEVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  ExprList *pEVar17;
  int iVar18;
  ExprList_item *pEVar19;
  Expr *p;
  int iCol;
  int local_b4;
  Expr *local_b0;
  int local_a4;
  Parse *local_a0;
  ExprList_item *local_98;
  sqlite3 *local_90;
  Select *local_88;
  Parse *local_80;
  ExprList *local_78;
  long local_70;
  NameContext local_68;
  
  pEVar17 = pSelect->pOrderBy;
  if (pEVar17 == (ExprList *)0x0) {
    return 0;
  }
  local_90 = pParse->db;
  uVar9 = pEVar17->nExpr;
  uVar16 = (ulong)uVar9;
  if (local_90->aLimit[2] < (int)uVar9) {
    sqlite3ErrorMsg(pParse,"too many terms in ORDER BY clause");
  }
  else {
    if (0 < (int)uVar9) {
      lVar11 = 0x19;
      lVar12 = 0;
      do {
        pbVar1 = (byte *)((long)&pEVar17->a->pExpr + lVar11);
        *pbVar1 = *pbVar1 & 0xfe;
        lVar12 = lVar12 + 1;
        uVar16 = (ulong)pEVar17->nExpr;
        lVar11 = lVar11 + 0x20;
      } while (lVar12 < (long)uVar16);
    }
    pSelect->pNext = (Select *)0x0;
    pSVar6 = pSelect->pPrior;
    while (pSVar5 = pSVar6, local_a0 = pParse, local_78 = pEVar17, pSVar5 != (Select *)0x0) {
      pSVar5->pNext = pSelect;
      pSelect = pSVar5;
      pSVar6 = pSVar5->pPrior;
    }
    do {
      if ((int)uVar16 < 1) {
        return 0;
      }
      local_80 = (Parse *)pSelect->pEList;
      pEVar19 = pEVar17->a;
      iVar15 = 0;
      local_a4 = 0;
      local_88 = pSelect;
      do {
        local_b4 = -1;
        if ((pEVar19->field_0x19 & 1) == 0) {
          for (p = pEVar19->pExpr; p != (Expr *)0x0; p = p->pLeft) {
            if ((p->op != '\\') && (p->op != '\x18')) goto LAB_0018758b;
          }
          p = (Expr *)0x0;
LAB_0018758b:
          iVar7 = sqlite3ExprIsInteger(p,&local_b4);
          if (iVar7 == 0) {
            iVar7 = resolveAsName(local_80,(ExprList *)p,pE);
            psVar3 = local_90;
            local_b4 = iVar7;
            if (iVar7 == 0) {
              pEVar10 = exprDup(local_90,p,0,(u8 **)0x0);
              iVar7 = local_b4;
              if (psVar3->mallocFailed == '\0') {
                local_98 = (ExprList_item *)local_88->pEList;
                local_68.pSrcList = local_88->pSrc;
                local_68.nRef = 0;
                local_68.nErr = 0;
                local_68.pAggInfo = (AggInfo *)0x0;
                local_68.pNext = (NameContext *)0x0;
                local_68.pParse = local_a0;
                local_68.ncFlags = '\x01';
                local_68._49_7_ = 0;
                psVar3 = local_a0->db;
                uVar2 = psVar3->suppressErr;
                psVar3->suppressErr = '\x01';
                local_b0 = pEVar10;
                local_68.pEList = (ExprList *)local_98;
                iVar8 = sqlite3ResolveExprNames(&local_68,pEVar10);
                psVar3->suppressErr = uVar2;
                iVar18 = 0;
                pEVar10 = local_b0;
                pEVar17 = local_78;
                iVar7 = iVar18;
                if ((iVar8 == 0) && (ppEVar4 = &local_98->pExpr, 0 < (long)*(int *)ppEVar4)) {
                  local_98 = (ExprList_item *)local_98->zName;
                  local_70 = (long)*(int *)ppEVar4 << 5;
                  iVar8 = 1;
                  lVar11 = 0;
                  do {
                    uVar9 = sqlite3ExprCompare(*(Expr **)((long)&local_98->pExpr + lVar11),local_b0)
                    ;
                    pEVar10 = local_b0;
                    pEVar17 = local_78;
                    iVar7 = iVar8;
                    if (uVar9 < 2) break;
                    iVar8 = iVar8 + 1;
                    lVar11 = lVar11 + 0x20;
                    iVar7 = iVar18;
                  } while (local_70 != lVar11);
                }
              }
              local_b4 = iVar7;
              iVar7 = local_b4;
              sqlite3ExprDelete(local_90,pEVar10);
            }
            if (iVar7 < 1) {
              local_a4 = 1;
              goto LAB_001876e9;
            }
          }
          else if ((local_b4 < 1) || (iVar7 = local_b4, *(int *)&local_80->db < local_b4)) {
            sqlite3ErrorMsg(local_a0,"%r %s BY term out of range - should be between 1 and %d",
                            (ulong)(iVar15 + 1),"ORDER");
            return 1;
          }
          psVar3 = local_90;
          local_68.pParse = (Parse *)0x0;
          local_68.pSrcList = (SrcList *)((ulong)local_68.pSrcList & 0xffffffff00000000);
          pEVar10 = sqlite3ExprAlloc(local_90,0x81,(Token *)&local_68,0);
          if (pEVar10 == (Expr *)0x0) {
            return 1;
          }
          pbVar1 = (byte *)((long)&pEVar10->flags + 1);
          *pbVar1 = *pbVar1 | 4;
          (pEVar10->u).iValue = iVar7;
          pEVar13 = (ExprList_item *)&pEVar19->pExpr->pLeft;
          if (pEVar19->pExpr == p) {
            pEVar13 = pEVar19;
          }
          pEVar13->pExpr = pEVar10;
          sqlite3ExprDelete(psVar3,p);
          pEVar19->iOrderByCol = (u16)local_b4;
          pEVar19->field_0x19 = pEVar19->field_0x19 | 1;
        }
LAB_001876e9:
        iVar15 = iVar15 + 1;
        pEVar19 = pEVar19 + 1;
        uVar9 = pEVar17->nExpr;
        uVar16 = (ulong)uVar9;
      } while (iVar15 < (int)uVar9);
      pSelect = local_88->pNext;
    } while ((pSelect != (Select *)0x0) && (local_a4 != 0));
    if ((int)uVar9 < 1) {
      return 0;
    }
    uVar14 = 1;
    lVar11 = 0;
    while (((&pEVar17->a->field_0x19)[lVar11] & 1) != 0) {
      uVar14 = (ulong)((int)uVar14 + 1);
      lVar11 = lVar11 + 0x20;
      if (uVar16 << 5 == lVar11) {
        return 0;
      }
    }
    sqlite3ErrorMsg(local_a0,"%r ORDER BY term does not match any column in the result set",uVar14);
  }
  return 1;
}

Assistant:

static int resolveCompoundOrderBy(
  Parse *pParse,        /* Parsing context.  Leave error messages here */
  Select *pSelect       /* The SELECT statement containing the ORDER BY */
){
  int i;
  ExprList *pOrderBy;
  ExprList *pEList;
  sqlite3 *db;
  int moreToDo = 1;

  pOrderBy = pSelect->pOrderBy;
  if( pOrderBy==0 ) return 0;
  db = pParse->db;
#if SQLITE_MAX_COLUMN
  if( pOrderBy->nExpr>db->aLimit[SQLITE_LIMIT_COLUMN] ){
    sqlite3ErrorMsg(pParse, "too many terms in ORDER BY clause");
    return 1;
  }
#endif
  for(i=0; i<pOrderBy->nExpr; i++){
    pOrderBy->a[i].done = 0;
  }
  pSelect->pNext = 0;
  while( pSelect->pPrior ){
    pSelect->pPrior->pNext = pSelect;
    pSelect = pSelect->pPrior;
  }
  while( pSelect && moreToDo ){
    struct ExprList_item *pItem;
    moreToDo = 0;
    pEList = pSelect->pEList;
    assert( pEList!=0 );
    for(i=0, pItem=pOrderBy->a; i<pOrderBy->nExpr; i++, pItem++){
      int iCol = -1;
      Expr *pE, *pDup;
      if( pItem->done ) continue;
      pE = sqlite3ExprSkipCollate(pItem->pExpr);
      if( sqlite3ExprIsInteger(pE, &iCol) ){
        if( iCol<=0 || iCol>pEList->nExpr ){
          resolveOutOfRangeError(pParse, "ORDER", i+1, pEList->nExpr);
          return 1;
        }
      }else{
        iCol = resolveAsName(pParse, pEList, pE);
        if( iCol==0 ){
          pDup = sqlite3ExprDup(db, pE, 0);
          if( !db->mallocFailed ){
            assert(pDup);
            iCol = resolveOrderByTermToExprList(pParse, pSelect, pDup);
          }
          sqlite3ExprDelete(db, pDup);
        }
      }
      if( iCol>0 ){
        /* Convert the ORDER BY term into an integer column number iCol,
        ** taking care to preserve the COLLATE clause if it exists */
        Expr *pNew = sqlite3Expr(db, TK_INTEGER, 0);
        if( pNew==0 ) return 1;
        pNew->flags |= EP_IntValue;
        pNew->u.iValue = iCol;
        if( pItem->pExpr==pE ){
          pItem->pExpr = pNew;
        }else{
          assert( pItem->pExpr->op==TK_COLLATE );
          assert( pItem->pExpr->pLeft==pE );
          pItem->pExpr->pLeft = pNew;
        }
        sqlite3ExprDelete(db, pE);
        pItem->iOrderByCol = (u16)iCol;
        pItem->done = 1;
      }else{
        moreToDo = 1;
      }
    }
    pSelect = pSelect->pNext;
  }
  for(i=0; i<pOrderBy->nExpr; i++){
    if( pOrderBy->a[i].done==0 ){
      sqlite3ErrorMsg(pParse, "%r ORDER BY term does not match any "
            "column in the result set", i+1);
      return 1;
    }
  }
  return 0;
}